

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Permutahedral_representation.h
# Opt level: O0

Face_range * __thiscall
Gudhi::coxeter_triangulation::
Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
::face_range(Face_range *__return_storage_ptr__,
            Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
            *this,size_t value_dim)

{
  Face_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  local_1a8;
  uint local_e4;
  Face_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  local_e0;
  size_t local_20;
  size_t value_dim_local;
  Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  *this_local;
  
  local_20._0_4_ = (uint)value_dim;
  local_e4 = (uint)local_20;
  local_20 = value_dim;
  value_dim_local = (size_t)this;
  this_local = (Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                *)__return_storage_ptr__;
  Face_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ::Face_iterator(&local_e0,this,&local_e4);
  Face_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ::Face_iterator(&local_1a8);
  boost::
  iterator_range<Gudhi::coxeter_triangulation::Face_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>>
  ::
  iterator_range<Gudhi::coxeter_triangulation::Face_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>>
            ((iterator_range<Gudhi::coxeter_triangulation::Face_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>>
              *)__return_storage_ptr__,&local_e0,&local_1a8);
  Face_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ::~Face_iterator(&local_1a8);
  Face_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ::~Face_iterator(&local_e0);
  return __return_storage_ptr__;
}

Assistant:

Face_range face_range(std::size_t value_dim) const {
    return Face_range(Face_iterator(*this, value_dim), Face_iterator());
  }